

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O0

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::StreamRead
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this,ssize_t nread)

{
  char *pcVar1;
  char *pcVar2;
  ssize_t nread_local;
  cmBasicUVStreambuf<char,_std::char_traits<char>_> *this_local;
  
  if (nread < 1) {
    if (nread < 0) {
      this->EndOfFile = true;
      uv_read_stop(this->Stream);
    }
  }
  else {
    pcVar1 = (char *)std::streambuf::eback();
    pcVar2 = (char *)std::streambuf::gptr();
    std::streambuf::egptr();
    std::streambuf::setg((char *)this,pcVar1,pcVar2);
    uv_read_stop(this->Stream);
  }
  return;
}

Assistant:

void cmBasicUVStreambuf<CharT, Traits>::StreamRead(ssize_t nread)
{
  if (nread > 0) {
    this->setg(this->eback(), this->gptr(),
               this->egptr() + nread / sizeof(CharT));
    uv_read_stop(this->Stream);
  } else if (nread < 0 /*|| nread == UV_EOF*/) {
    this->EndOfFile = true;
    uv_read_stop(this->Stream);
  }
}